

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

void CuStringAppend(CuString *str,char *text)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  long lVar3;
  size_t __size;
  
  __s = "NULL";
  if (text != (char *)0x0) {
    __s = text;
  }
  sVar1 = strlen(__s);
  lVar3 = (long)(int)sVar1 + (long)str->length;
  if (str->size <= (int)lVar3 + 1) {
    __size = lVar3 + 0x101;
    pcVar2 = (char *)realloc(str->buffer,__size);
    str->buffer = pcVar2;
    str->size = (int)__size;
  }
  str->length = str->length + (int)sVar1;
  strcat(str->buffer,__s);
  return;
}

Assistant:

void CuStringAppend(CuString* str, const char* text)
{
	int length;

	if (text == NULL) {
		text = "NULL";
	}

	length = strlen(text);
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	str->length += length;
	strcat(str->buffer, text);
}